

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kmp_runtime.c
# Opt level: O0

void interop_kmp_omp_thread_launcher(int gtid)

{
  undefined8 *puVar1;
  int in_EDI;
  kmp_info_t *unaff_retaddr;
  kmp_team_t *team;
  omp_thread_t *th;
  kmp_info_t *kmp_thread;
  
  puVar1 = (undefined8 *)(__kmp_threads[in_EDI]->th).interop_thr;
  (*(code *)*puVar1)(puVar1[1]);
  *(undefined4 *)(puVar1 + 3) = 1;
  __kmp_free_team((kmp_root_t *)th,team,unaff_retaddr);
  return;
}

Assistant:

void static interop_kmp_omp_thread_launcher(int gtid) {
    kmp_info_t * kmp_thread = __kmp_threads[gtid];
    omp_thread_t * th = (omp_thread_t*) kmp_thread->th.interop_thr;
    if (th->new_stack) {
        /* use setjmp/longjmp pair to change stack */
    }
    th->start_routine(th->arg);
    th->join_counter = 1;

    if (th->new_stack) {
        /* use setjmp/longjmp pair to change back to the original stack */
    }

    /* the free team will not free the original master thread, it will return the team and the thread back to the pool */
    kmp_team_t * team = kmp_thread->th.th_team;
    __kmp_free_team(kmp_thread->th.th_root, team, NULL);
}